

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  undefined1 uVar1;
  size_type sVar2;
  Scene *defaultStyle;
  vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *in_RSI;
  Application *in_RDI;
  double max_view_distance;
  double min_view_distance;
  double view_distance;
  Vector3D target;
  BBox *bbox;
  LightInfo default_light;
  Matrix4x4 *transform;
  Instance *instance;
  Node *node;
  int i;
  int len;
  Vector3D c_dir;
  Vector3D c_pos;
  CameraInfo *c;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  lights;
  vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *nodes;
  LightInfo *in_stack_fffffffffffffc78;
  AmbientLight *in_stack_fffffffffffffc80;
  CameraInfo *in_stack_fffffffffffffc88;
  Application *in_stack_fffffffffffffc90;
  PolymeshInfo *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  Scene *in_stack_fffffffffffffcb0;
  SceneObject *in_stack_fffffffffffffcb8;
  SceneObject *in_stack_fffffffffffffcc0;
  Application *in_stack_fffffffffffffcc8;
  Matrix4x4 *in_stack_fffffffffffffcd0;
  LightInfo *in_stack_fffffffffffffce0;
  Scene *in_stack_fffffffffffffcf8;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  *in_stack_fffffffffffffd30;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *in_stack_fffffffffffffd38;
  Scene *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  Matrix4x4 *in_stack_fffffffffffffd78;
  Matrix4x4 *in_stack_fffffffffffffda0;
  SphereInfo *in_stack_fffffffffffffda8;
  Application *in_stack_fffffffffffffdb0;
  Vector4D local_180 [2];
  double local_128;
  double dStack_120;
  double local_118;
  Vector4D local_110 [2];
  double local_d0;
  double dStack_c8;
  double local_c0;
  Matrix4x4 *local_b8;
  MaterialInfo *local_b0;
  reference local_a8;
  int local_a0;
  int local_9c;
  Vector3D local_98 [2];
  Vector3D local_68;
  MaterialInfo *local_50;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  local_30;
  vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *local_18;
  
  local_18 = in_RSI;
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)0x249551);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)0x24955e);
  Vector3D::Vector3D(&local_68);
  Vector3D::Vector3D(local_98);
  sVar2 = std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::size(local_18);
  local_9c = (int)sVar2;
  for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
    local_a8 = std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::operator[]
                         (local_18,(long)local_a0);
    local_b0 = (MaterialInfo *)local_a8->instance;
    local_b8 = &local_a8->transform;
    in_stack_fffffffffffffce0 = (LightInfo *)(ulong)(local_b0->super_Instance).type;
    switch(in_stack_fffffffffffffce0) {
    case (LightInfo *)0x0:
      local_50 = local_b0;
      Vector4D::Vector4D(local_110,&local_68,1.0);
      Matrix4x4::operator*
                (in_stack_fffffffffffffd78,
                 (Vector4D *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      Vector4D::to3D((Vector4D *)in_stack_fffffffffffffc78);
      local_68.z = local_c0;
      local_68.x = local_d0;
      local_68.y = dStack_c8;
      in_stack_fffffffffffffcd0 = local_b8;
      Vector4D::Vector4D(local_180,(Vector3D *)&local_50->bsdf,1.0);
      Matrix4x4::operator*
                (in_stack_fffffffffffffd78,
                 (Vector4D *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      Vector4D::to3D((Vector4D *)in_stack_fffffffffffffc78);
      Vector3D::unit((Vector3D *)in_stack_fffffffffffffc98);
      local_98[0].z = local_118;
      local_98[0].x = local_128;
      local_98[0].y = dStack_120;
      init_camera(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                  (Matrix4x4 *)in_stack_fffffffffffffc80);
      break;
    case (LightInfo *)0x1:
      in_stack_fffffffffffffcc8 =
           (Application *)
           init_light(in_stack_fffffffffffffcc8,(LightInfo *)in_stack_fffffffffffffcc0,
                      (Matrix4x4 *)in_stack_fffffffffffffcb8);
      std::
      vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
      ::push_back((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      break;
    case (LightInfo *)0x2:
      in_stack_fffffffffffffcc0 =
           init_sphere(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0
                      );
      std::
      vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ::push_back((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      break;
    case (LightInfo *)0x3:
      in_stack_fffffffffffffcb8 =
           init_polymesh((Application *)
                         CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                         in_stack_fffffffffffffc98,(Matrix4x4 *)in_stack_fffffffffffffc90);
      std::
      vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ::push_back((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      break;
    case (LightInfo *)0x4:
      init_material(in_RDI,local_b0);
    }
  }
  sVar2 = std::
          vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
          ::size(&local_30);
  if (sVar2 == 0) {
    Collada::LightInfo::LightInfo(in_stack_fffffffffffffce0);
    in_stack_fffffffffffffcb0 = (Scene *)operator_new(0x18);
    DynamicScene::AmbientLight::AmbientLight(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::
    vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>::
    push_back((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
               *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
    Collada::LightInfo::~LightInfo((LightInfo *)0x249907);
  }
  defaultStyle = (Scene *)operator_new(0x128);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)in_stack_fffffffffffffcd0,
         (vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)in_stack_fffffffffffffcc8);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)in_stack_fffffffffffffcd0,
           (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)in_stack_fffffffffffffcc8);
  DynamicScene::Scene::Scene
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  in_RDI->scene = defaultStyle;
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
             *)in_stack_fffffffffffffc90);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  ~vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
           *)in_stack_fffffffffffffc90);
  DynamicScene::Scene::get_bbox(in_stack_fffffffffffffcf8);
  uVar1 = BBox::empty((BBox *)&stack0xfffffffffffffd20);
  if (!(bool)uVar1) {
    BBox::centroid((BBox *)defaultStyle);
    in_stack_fffffffffffffc98 = (PolymeshInfo *)Vector3D::norm((Vector3D *)0x249a53);
    in_RDI->canonical_view_distance = (double)in_stack_fffffffffffffc98 * 0.5 * 1.5;
    in_stack_fffffffffffffc90 = (Application *)acos(local_98[0].y);
    atan2(local_98[0].x,local_98[0].z);
    Camera::place((Camera *)in_stack_fffffffffffffcc0,(Vector3D *)in_stack_fffffffffffffcb8,
                  (double)in_stack_fffffffffffffcb0,(double)defaultStyle,
                  (double)CONCAT17(uVar1,in_stack_fffffffffffffca0),
                  (double)in_stack_fffffffffffffc98,(double)in_stack_fffffffffffffc90);
    acos(local_98[0].y);
    atan2(local_98[0].x,local_98[0].z);
    Camera::place((Camera *)in_stack_fffffffffffffcc0,(Vector3D *)in_stack_fffffffffffffcb8,
                  (double)in_stack_fffffffffffffcb0,(double)defaultStyle,
                  (double)CONCAT17(uVar1,in_stack_fffffffffffffca0),
                  (double)in_stack_fffffffffffffc98,(double)in_stack_fffffffffffffc90);
    set_scroll_rate(in_RDI);
  }
  DynamicScene::Scene::set_draw_styles
            (in_stack_fffffffffffffcb0,(DrawStyle *)defaultStyle,
             (DrawStyle *)CONCAT17(uVar1,in_stack_fffffffffffffca0),
             (DrawStyle *)in_stack_fffffffffffffc98);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  ~vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
           *)in_stack_fffffffffffffc90);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
             *)in_stack_fffffffffffffc90);
  return;
}

Assistant:

void Application::load(SceneInfo *sceneInfo) {
  vector<Collada::Node> &nodes = sceneInfo->nodes;
  vector<DynamicScene::SceneLight *> lights;
  vector<DynamicScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node &node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4 &transform = node.transform;

    switch (instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo *>(instance);
        c_pos = (transform * Vector4D(c_pos, 1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir, 1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT: {
        lights.push_back(
            init_light(static_cast<LightInfo &>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
            init_sphere(static_cast<SphereInfo &>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
            init_polymesh(static_cast<PolymeshInfo &>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo &>(*instance));
        break;
    }
  }

  if (lights.size() == 0) {  // no lights, default use ambient_light
    LightInfo default_light = LightInfo();
    lights.push_back(new DynamicScene::AmbientLight(default_light));
  }
  scene = new DynamicScene::Scene(objects, lights);

  const BBox &bbox = scene->get_bbox();
  if (!bbox.empty()) {
    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target, acos(c_dir.y), atan2(c_dir.x, c_dir.z),
                          view_distance, min_view_distance, max_view_distance);

    camera.place(target, acos(c_dir.y), atan2(c_dir.x, c_dir.z), view_distance,
                 min_view_distance, max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

  // cerr << "==================================" << endl;
  // cerr << "CAMERA" << endl;
  // cerr << "      hFov: " << camera.hFov << endl;
  // cerr << "      vFov: " << camera.vFov << endl;
  // cerr << "        ar: " << camera.ar << endl;
  // cerr << "     nClip: " << camera.nClip << endl;
  // cerr << "     fClip: " << camera.fClip << endl;
  // cerr << "       pos: " << camera.pos << endl;
  // cerr << " targetPos: " << camera.targetPos << endl;
  // cerr << "       phi: " << camera.phi << endl;
  // cerr << "     theta: " << camera.theta << endl;
  // cerr << "         r: " << camera.r << endl;
  // cerr << "      minR: " << camera.minR << endl;
  // cerr << "      maxR: " << camera.maxR << endl;
  // cerr << "       c2w: " << camera.c2w << endl;
  // cerr << "   screenW: " << camera.screenW << endl;
  // cerr << "   screenH: " << camera.screenH << endl;
  // cerr << "screenDist: " << camera.screenDist<< endl;
  // cerr << "==================================" << endl;
}